

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

CollSeq * sqlite3GetFuncCollSeq(sqlite3_context *context)

{
  VdbeOp *pOp;
  sqlite3_context *context_local;
  
  return (CollSeq *)context->pVdbe->aOp[context->iOp + -1].p4.p;
}

Assistant:

static CollSeq *sqlite3GetFuncCollSeq(sqlite3_context *context){
  VdbeOp *pOp;
  assert( context->pVdbe!=0 );
  pOp = &context->pVdbe->aOp[context->iOp-1];
  assert( pOp->opcode==OP_CollSeq );
  assert( pOp->p4type==P4_COLLSEQ );
  return pOp->p4.pColl;
}